

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

int Cof_ManTfiSize(Cof_Man_t *p,Cof_Obj_t **ppObjs,int nObjs)

{
  int iVar1;
  Cof_Obj_t *pObj;
  int local_24;
  int local_20;
  int Counter;
  int i;
  int nObjs_local;
  Cof_Obj_t **ppObjs_local;
  Cof_Man_t *p_local;
  
  local_24 = 0;
  Cof_ManIncrementTravId(p);
  for (local_20 = 0; local_20 < nObjs; local_20 = local_20 + 1) {
    iVar1 = Cof_ObjIsCo(ppObjs[local_20]);
    if (iVar1 == 0) {
      iVar1 = Cof_ManTfiSize_rec(p,ppObjs[local_20]);
    }
    else {
      pObj = Cof_ObjFanin(ppObjs[local_20],0);
      iVar1 = Cof_ManTfiSize_rec(p,pObj);
    }
    local_24 = iVar1 + local_24;
  }
  return local_24;
}

Assistant:

int Cof_ManTfiSize( Cof_Man_t * p, Cof_Obj_t ** ppObjs, int nObjs )
{
    int i, Counter = 0; 
    Cof_ManIncrementTravId( p );
    for ( i = 0; i < nObjs; i++ )
        if ( Cof_ObjIsCo(ppObjs[i]) )
            Counter += Cof_ManTfiSize_rec( p, Cof_ObjFanin(ppObjs[i],0) );
        else
            Counter += Cof_ManTfiSize_rec( p, ppObjs[i] );
    return Counter;
}